

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.h
# Opt level: O3

void __thiscall MeshLib::VertexInHalfedgeIterator::operator++(VertexInHalfedgeIterator *this)

{
  HalfEdge *pHVar1;
  HalfEdge *pHVar2;
  tHalfEdge pHVar3;
  TopologyException *this_00;
  Vertex *this_01;
  
  pHVar1 = this->m_halfedge;
  if (pHVar1 != (HalfEdge *)0x0) {
    this_01 = this->m_vertex;
    pHVar2 = Vertex::most_ccw_in_halfedge(this_01);
    if (pHVar1 == pHVar2) {
      pHVar3 = (tHalfEdge)0x0;
    }
    else {
      pHVar3 = Solid::vertexNextCcwInHalfEdge((Solid *)this_01,this->m_halfedge);
    }
    this->m_halfedge = pHVar3;
    return;
  }
  this_00 = (TopologyException *)__cxa_allocate_exception(8);
  TopologyException::TopologyException(this_00,"iterators");
  __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
}

Assistant:

void operator++()
	{
		if( m_halfedge == NULL ) throw TopologyException("iterators"); 
		 if( m_halfedge == m_solid->vertexMostCcwInHalfEdge(m_vertex) ) 
			 m_halfedge = NULL; 
		else
			m_halfedge = m_solid->vertexNextCcwInHalfEdge(m_halfedge); 
	}